

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

BasicBlock * __thiscall spvtools::opt::Loop::GetOrCreatePreHeaderBlock(Loop *this)

{
  CFG *this_00;
  BasicBlock *pBVar1;
  CFG *cfg;
  Loop *this_local;
  
  if (this->loop_preheader_ == (BasicBlock *)0x0) {
    this_00 = IRContext::cfg(this->context_);
    pBVar1 = CFG::SplitLoopHeader(this_00,this->loop_header_);
    this->loop_header_ = pBVar1;
    this_local = (Loop *)this->loop_preheader_;
  }
  else {
    this_local = (Loop *)this->loop_preheader_;
  }
  return (BasicBlock *)this_local;
}

Assistant:

BasicBlock* Loop::GetOrCreatePreHeaderBlock() {
  if (loop_preheader_) return loop_preheader_;

  CFG* cfg = context_->cfg();
  loop_header_ = cfg->SplitLoopHeader(loop_header_);
  return loop_preheader_;
}